

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Tracer.cpp
# Opt level: O3

EStatusCode __thiscall
CharStringType2Tracer::TraceGlyphProgram
          (CharStringType2Tracer *this,unsigned_short inFontIndex,unsigned_short inGlyphIndex,
          CFFFileInput *inCFFFileInput,IByteWriter *inWriter)

{
  EStatusCode EVar1;
  Trace *pTVar2;
  CharString *inCharStringToIntepret;
  CharStringType2Interpreter interpreter;
  CharStringType2Interpreter local_80;
  
  CharStringType2Interpreter::CharStringType2Interpreter(&local_80);
  EVar1 = CFFFileInput::PrepareForGlyphIntepretation(inCFFFileInput,inFontIndex,inGlyphIndex);
  this->mWriter = inWriter;
  this->mHelper = inCFFFileInput;
  PrimitiveObjectsWriter::SetStreamForWriting(&this->mPrimitiveWriter,inWriter);
  this->mStemsCount = 0;
  if (EVar1 == eSuccess) {
    inCharStringToIntepret =
         CFFFileInput::GetGlyphCharString(inCFFFileInput,inFontIndex,inGlyphIndex);
    if (inCharStringToIntepret == (CharString *)0x0) {
      pTVar2 = Trace::DefaultTrace();
      EVar1 = eSuccess;
      Trace::TraceToLog(pTVar2,"CharStringType2Tracer::Trace, Exception, cannot find glyph index");
    }
    else {
      EVar1 = CharStringType2Interpreter::Intepret
                        (&local_80,inCharStringToIntepret,
                         &this->super_IType2InterpreterImplementation);
    }
  }
  else {
    pTVar2 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar2,
                      "CharStringType2Tracer::Trace, Exception, cannot prepare for glyph interpretation"
                     );
  }
  CharStringType2Interpreter::~CharStringType2Interpreter(&local_80);
  return EVar1;
}

Assistant:

EStatusCode CharStringType2Tracer::TraceGlyphProgram(unsigned short inFontIndex, 
													unsigned short inGlyphIndex, 
													CFFFileInput* inCFFFileInput, 
													IByteWriter* inWriter)
{
	CharStringType2Interpreter interpreter;
	EStatusCode status = inCFFFileInput->PrepareForGlyphIntepretation(inFontIndex,inGlyphIndex);

	mWriter = inWriter;
	mHelper = inCFFFileInput;
	mPrimitiveWriter.SetStreamForWriting(inWriter);
	mStemsCount = 0;

	do
	{
		if(status != eSuccess)
		{
			TRACE_LOG("CharStringType2Tracer::Trace, Exception, cannot prepare for glyph interpretation");
			break;
		}
		
		CharString* charString = inCFFFileInput->GetGlyphCharString(inFontIndex,inGlyphIndex);
		if(!charString)
		{
			TRACE_LOG("CharStringType2Tracer::Trace, Exception, cannot find glyph index");
			break;
		}

		status = interpreter.Intepret(*charString,this);

	}while(false);
	return status;
}